

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.h
# Opt level: O0

void __thiscall cmCMakePresetsGraph::Preset::~Preset(Preset *this)

{
  code *pcVar1;
  Preset *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~Preset() = default;